

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O1

void wallet::SetFeeEstimateMode
               (CWallet *wallet,CCoinControl *cc,UniValue *conf_target,UniValue *estimate_mode,
               UniValue *fee_rate,bool override_min_fee)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  string *psVar4;
  _Storage<CFeeRate,_true> _Var5;
  UniValue *pUVar6;
  long in_FS_OFFSET;
  string local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (fee_rate->typ == VNULL) {
    if (estimate_mode->typ != VNULL) {
      psVar4 = ::UniValue::get_str_abi_cxx11_(estimate_mode);
      bVar1 = common::FeeModeFromString(psVar4,&cc->m_fee_mode);
      if (!bVar1) {
        pUVar6 = (UniValue *)__cxa_allocate_exception(0x58);
        common::InvalidEstimateModeErrorMessage_abi_cxx11_();
        JSONRPCError(pUVar6,-8,&local_50);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
          __cxa_throw(pUVar6,&::UniValue::typeinfo,::UniValue::~UniValue);
        }
        goto LAB_00cdeceb;
      }
    }
    if (conf_target->typ != VNULL) {
      if (wallet->m_chain == (Chain *)0x0) {
        __assert_fail("m_chain",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.h"
                      ,0x1f5,"interfaces::Chain &wallet::CWallet::chain() const");
      }
      uVar3 = (*wallet->m_chain->_vptr_Chain[0x1c])();
      uVar3 = ParseConfirmTarget(conf_target,uVar3);
      (cc->m_confirm_target).super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int> =
           (_Optional_payload_base<unsigned_int>)((ulong)uVar3 | 0x100000000);
    }
  }
  else {
    if (conf_target->typ != VNULL) {
      pUVar6 = (UniValue *)__cxa_allocate_exception(0x58);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,
                 "Cannot specify both conf_target and fee_rate. Please provide either a confirmation target in blocks for automatic fee estimation, or an explicit fee rate."
                 ,"");
      JSONRPCError(pUVar6,-8,&local_50);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        __cxa_throw(pUVar6,&::UniValue::typeinfo,::UniValue::~UniValue);
      }
      goto LAB_00cdeceb;
    }
    if (estimate_mode->typ != VNULL) {
      psVar4 = ::UniValue::get_str_abi_cxx11_(estimate_mode);
      iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(psVar4,"unset");
      if (iVar2 != 0) {
        pUVar6 = (UniValue *)__cxa_allocate_exception(0x58);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"Cannot specify both estimate_mode and fee_rate","");
        JSONRPCError(pUVar6,-8,&local_50);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
          __cxa_throw(pUVar6,&::UniValue::typeinfo,::UniValue::~UniValue);
        }
        goto LAB_00cdeceb;
      }
    }
    _Var5 = (_Storage<CFeeRate,_true>)AmountFromValue(fee_rate,3);
    (cc->m_feerate).super__Optional_base<CFeeRate,_true,_true>._M_payload.
    super__Optional_payload_base<CFeeRate>._M_payload = _Var5;
    if ((cc->m_feerate).super__Optional_base<CFeeRate,_true,_true>._M_payload.
        super__Optional_payload_base<CFeeRate>._M_engaged == false) {
      (cc->m_feerate).super__Optional_base<CFeeRate,_true,_true>._M_payload.
      super__Optional_payload_base<CFeeRate>._M_engaged = true;
    }
    if (override_min_fee) {
      cc->fOverrideFeeRate = true;
    }
    if ((cc->m_signal_bip125_rbf).super__Optional_base<bool,_true,_true>._M_payload.
        super__Optional_payload_base<bool>._M_engaged == false) {
      (cc->m_signal_bip125_rbf).super__Optional_base<bool,_true,_true>._M_payload.
      super__Optional_payload_base<bool> = (_Optional_payload_base<bool>)0x101;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
LAB_00cdeceb:
  __stack_chk_fail();
}

Assistant:

static void SetFeeEstimateMode(const CWallet& wallet, CCoinControl& cc, const UniValue& conf_target, const UniValue& estimate_mode, const UniValue& fee_rate, bool override_min_fee)
{
    if (!fee_rate.isNull()) {
        if (!conf_target.isNull()) {
            throw JSONRPCError(RPC_INVALID_PARAMETER, "Cannot specify both conf_target and fee_rate. Please provide either a confirmation target in blocks for automatic fee estimation, or an explicit fee rate.");
        }
        if (!estimate_mode.isNull() && estimate_mode.get_str() != "unset") {
            throw JSONRPCError(RPC_INVALID_PARAMETER, "Cannot specify both estimate_mode and fee_rate");
        }
        // Fee rates in sat/vB cannot represent more than 3 significant digits.
        cc.m_feerate = CFeeRate{AmountFromValue(fee_rate, /*decimals=*/3)};
        if (override_min_fee) cc.fOverrideFeeRate = true;
        // Default RBF to true for explicit fee_rate, if unset.
        if (!cc.m_signal_bip125_rbf) cc.m_signal_bip125_rbf = true;
        return;
    }
    if (!estimate_mode.isNull() && !FeeModeFromString(estimate_mode.get_str(), cc.m_fee_mode)) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, InvalidEstimateModeErrorMessage());
    }
    if (!conf_target.isNull()) {
        cc.m_confirm_target = ParseConfirmTarget(conf_target, wallet.chain().estimateMaxBlocks());
    }
}